

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

void dumpTypeName(raw_ostream *OS,DWARFDie *D)

{
  undefined1 *puVar1;
  DWARFDebugInfoEntry **this;
  char C;
  OptionalStorage<unsigned_int,_true> OVar2;
  bool bVar3;
  Tag TVar4;
  char *pcVar5;
  raw_ostream *prVar6;
  DWARFFormValue *pDVar7;
  SourceLanguage *pSVar8;
  unsigned_long *puVar9;
  uint *puVar10;
  undefined1 *puVar11;
  unsigned_long uVar12;
  DWARFUnit *pDVar13;
  uint Tag;
  StringRef Prefix;
  StringRef Suffix;
  StringRef Str;
  Optional<unsigned_long> OVar14;
  undefined1 local_100 [8];
  iterator __begin2;
  DWARFUnit *local_e8;
  undefined1 local_e0 [8];
  DWARFDie TypeDie;
  DWARFDie Cont;
  DWARFUnit *local_b8;
  char local_a0;
  undefined1 local_90 [8];
  iterator __begin1;
  undefined7 uStack_77;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_70;
  char local_68;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_60;
  char local_58;
  DWARFUnit *local_50;
  OptionalStorage<unsigned_int,_true> local_48;
  Optional<unsigned_int> DefaultLB;
  bool local_38;
  
  if (D->U == (DWARFUnit *)0x0) {
    return;
  }
  if (D->Die == (DWARFDebugInfoEntry *)0x0) {
    return;
  }
  pcVar5 = llvm::DWARFDie::getName(D,LinkageName);
  if (pcVar5 != (char *)0x0) {
    llvm::raw_ostream::operator<<(OS,pcVar5);
    return;
  }
  TVar4 = llvm::DWARFDie::getTag(D);
  Tag = (uint)TVar4;
  if (((0x33 < TVar4 - 0xf) || ((0x8000000010043U >> ((ulong)(TVar4 - 0xf) & 0x3f) & 1) == 0)) &&
     (Tag != 1)) {
    join_0x00000010_0x00000000_ = llvm::dwarf::TagString(Tag);
    Prefix.Length = 7;
    Prefix.Data = "DW_TAG_";
    bVar3 = llvm::StringRef::startswith((StringRef *)&TypeDie.Die,Prefix);
    if ((bVar3) &&
       (Suffix.Length = 5, Suffix.Data = "_type",
       bVar3 = llvm::StringRef::endswith((StringRef *)&TypeDie.Die,Suffix), bVar3)) {
      pDVar13 = (DWARFUnit *)0x7;
      if (Cont.U < (DWARFUnit *)0x7) {
        pDVar13 = Cont.U;
      }
      puVar1 = (undefined1 *)
               ((long)&Cont.U[-1].DWO.
                       super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4);
      puVar11 = (undefined1 *)((long)Cont.U - (long)pDVar13);
      if (puVar1 <= (undefined1 *)((long)Cont.U - (long)pDVar13)) {
        puVar11 = puVar1;
      }
      Str.Length = (size_t)puVar11;
      Str.Data = (char *)((long)&(TypeDie.Die)->Offset + (long)&pDVar13->_vptr_DWARFUnit);
      prVar6 = llvm::raw_ostream::operator<<(OS,Str);
      llvm::raw_ostream::operator<<(prVar6," ");
    }
  }
  _local_e0 = llvm::DWARFDie::getAttributeValueAsReferencedDie(D,DW_AT_type);
  dumpTypeName(OS,(DWARFDie *)local_e0);
  if (TVar4 == DW_TAG_array_type) {
    llvm::DWARFDie::children((iterator_range<llvm::DWARFDie::iterator> *)&stack0xffffffffffffff00,D)
    ;
    __begin1.Die.U = __begin2.Die.U;
    local_90 = local_100;
    local_50 = local_e8;
    do {
      if ((__begin2.Die.U == local_e8) && (local_100 == (undefined1  [8])__begin2.Die.Die)) {
        return;
      }
      TVar4 = llvm::DWARFDie::getTag((DWARFDie *)local_90);
      OVar2 = local_48;
      if (TVar4 == DW_TAG_subrange_type) {
        DefaultLB.Storage = DefaultLB.Storage & 0xffffffffffffff00;
        local_38 = false;
        local_60.value = local_60.value & 0xffffffffffffff00;
        local_58 = '\0';
        local_70.value = local_70.value & 0xffffffffffffff00;
        local_68 = '\0';
        local_48.field_0.value = local_48.field_0.value & 0xffffff00;
        local_48._5_3_ = OVar2._5_3_;
        local_48.hasVal = false;
        this = &TypeDie.Die;
        llvm::DWARFDie::find
                  ((Optional<llvm::DWARFFormValue> *)this,(DWARFDie *)local_90,DW_AT_lower_bound);
        if (local_a0 == '\x01') {
          pDVar7 = llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                             ((OptionalStorage<llvm::DWARFFormValue,_true> *)this);
          OVar14 = llvm::DWARFFormValue::getAsUnsignedConstant(pDVar7);
          DefaultLB.Storage = (OptionalStorage<unsigned_int,_true>)OVar14.Storage.field_0;
          local_38 = OVar14.Storage.hasVal;
        }
        llvm::DWARFDie::find
                  ((Optional<llvm::DWARFFormValue> *)this,(DWARFDie *)local_90,DW_AT_count);
        if (local_a0 == '\x01') {
          pDVar7 = llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                             ((OptionalStorage<llvm::DWARFFormValue,_true> *)this);
          OVar14 = llvm::DWARFFormValue::getAsUnsignedConstant(pDVar7);
          local_60 = OVar14.Storage.field_0;
          local_58 = OVar14.Storage.hasVal;
        }
        llvm::DWARFDie::find
                  ((Optional<llvm::DWARFFormValue> *)this,(DWARFDie *)local_90,DW_AT_upper_bound);
        if (local_a0 == '\x01') {
          pDVar7 = llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                             ((OptionalStorage<llvm::DWARFFormValue,_true> *)this);
          OVar14 = llvm::DWARFFormValue::getAsUnsignedConstant(pDVar7);
          local_70 = OVar14.Storage.field_0;
          local_68 = OVar14.Storage.hasVal;
        }
        join_0x00000010_0x00000000_ = llvm::DWARFUnit::getUnitDIE(D->U,true);
        llvm::DWARFDie::find
                  ((Optional<llvm::DWARFFormValue> *)this,(DWARFDie *)&__begin1.Die.Die,
                   DW_AT_language);
        if (local_a0 == '\x01') {
          pDVar7 = llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                             ((OptionalStorage<llvm::DWARFFormValue,_true> *)&TypeDie.Die);
          OVar14 = llvm::DWARFFormValue::getAsUnsignedConstant(pDVar7);
          stack0xffffffffffffff80 = OVar14.Storage._0_9_;
          if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pSVar8 = (SourceLanguage *)
                     llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                               ((OptionalStorage<unsigned_long,_true> *)&__begin1.Die.Die);
            local_48 = (OptionalStorage<unsigned_int,_true>)llvm::dwarf::LanguageLowerBound(*pSVar8)
            ;
            if ((((ulong)local_48 >> 0x20 & 1) != 0) && (local_38 == true)) {
              puVar9 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                                 ((OptionalStorage<unsigned_long,_true> *)&DefaultLB);
              uVar12 = *puVar9;
              puVar10 = llvm::optional_detail::OptionalStorage<unsigned_int,_true>::getValue
                                  (&local_48);
              local_e8 = local_50;
              if (uVar12 == *puVar10) {
                DefaultLB.Storage = DefaultLB.Storage & 0xffffffffffffff00;
                local_38 = false;
              }
            }
          }
        }
        if (local_38 == false) {
          if ((local_58 != '\0') || (local_68 != '\0')) {
            if (local_48.hasVal == true) {
              prVar6 = llvm::raw_ostream::operator<<(OS,'[');
              if (local_58 == '\x01') {
                puVar9 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                                   ((OptionalStorage<unsigned_long,_true> *)&local_60);
                uVar12 = *puVar9;
              }
              else {
                puVar9 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                                   ((OptionalStorage<unsigned_long,_true> *)&local_70);
                uVar12 = *puVar9;
                puVar10 = llvm::optional_detail::OptionalStorage<unsigned_int,_true>::getValue
                                    (&local_48);
                uVar12 = (uVar12 - *puVar10) + 1;
              }
              prVar6 = llvm::raw_ostream::operator<<(prVar6,uVar12);
              llvm::raw_ostream::operator<<(prVar6,']');
              local_e8 = local_50;
              goto LAB_00d978ce;
            }
            goto LAB_00d977f8;
          }
          pcVar5 = "[]";
        }
        else {
LAB_00d977f8:
          llvm::raw_ostream::operator<<(OS,"[[");
          if (local_38 == true) {
            puVar9 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                               ((OptionalStorage<unsigned_long,_true> *)&DefaultLB);
            llvm::raw_ostream::operator<<(OS,*puVar9);
          }
          else {
            llvm::raw_ostream::operator<<(OS,'?');
          }
          llvm::raw_ostream::operator<<(OS,", ");
          if (local_58 == '\x01') {
            if (local_38 == true) {
              puVar9 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                                 ((OptionalStorage<unsigned_long,_true> *)&DefaultLB);
              uVar12 = *puVar9;
              puVar9 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                                 ((OptionalStorage<unsigned_long,_true> *)&local_60);
              uVar12 = uVar12 + *puVar9;
              prVar6 = OS;
            }
            else {
              prVar6 = llvm::raw_ostream::operator<<(OS,"? + ");
              puVar9 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                                 ((OptionalStorage<unsigned_long,_true> *)&local_60);
              uVar12 = *puVar9;
            }
            llvm::raw_ostream::operator<<(prVar6,uVar12);
            local_e8 = local_50;
          }
          else if (local_68 == '\x01') {
            puVar9 = llvm::optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                               ((OptionalStorage<unsigned_long,_true> *)&local_70);
            llvm::raw_ostream::operator<<(OS,*puVar9 + 1);
          }
          else {
            llvm::raw_ostream::operator<<(OS,'?');
          }
          pcVar5 = ")]";
        }
        llvm::raw_ostream::operator<<(OS,pcVar5);
      }
LAB_00d978ce:
      llvm::DWARFDie::iterator::operator++((iterator *)local_90);
      local_100 = local_90;
      __begin2.Die.U = __begin1.Die.U;
    } while( true );
  }
  if (TVar4 != DW_TAG_pointer_type) {
    if (TVar4 == DW_TAG_reference_type) {
      C = '&';
      goto LAB_00d975e9;
    }
    if (Tag == 0x42) {
      llvm::raw_ostream::operator<<(OS,"&&");
      return;
    }
    if (Tag != 0x1f) {
      if (Tag != 0x15) {
        return;
      }
      if ((local_e0 == (undefined1  [8])0x0) || (TypeDie.U == (DWARFUnit *)0x0)) {
        llvm::raw_ostream::operator<<(OS,"void");
      }
      llvm::raw_ostream::operator<<(OS,'(');
      llvm::DWARFDie::children((iterator_range<llvm::DWARFDie::iterator> *)&TypeDie.Die,D);
      local_100 = (undefined1  [8])TypeDie.Die;
      __begin2.Die.U = Cont.U;
      bVar3 = true;
      while ((__begin2.Die.U != local_b8 || (local_100 != (undefined1  [8])Cont.Die))) {
        TVar4 = llvm::DWARFDie::getTag((DWARFDie *)&stack0xffffffffffffff00);
        if (TVar4 == DW_TAG_formal_parameter) {
          if (!bVar3) {
            llvm::raw_ostream::operator<<(OS,", ");
          }
          _local_90 = llvm::DWARFDie::getAttributeValueAsReferencedDie
                                ((DWARFDie *)&stack0xffffffffffffff00,DW_AT_type);
          dumpTypeName(OS,(DWARFDie *)local_90);
          bVar3 = false;
        }
        llvm::DWARFDie::iterator::operator++((iterator *)&stack0xffffffffffffff00);
      }
      C = ')';
      goto LAB_00d975e9;
    }
    join_0x00000010_0x00000000_ =
         (StringRef)llvm::DWARFDie::getAttributeValueAsReferencedDie(D,DW_AT_containing_type);
    if (TypeDie._16_8_ != 0 && TypeDie.Die != (char *)0x0) {
      prVar6 = llvm::raw_ostream::operator<<(OS,' ');
      dumpTypeName(prVar6,(DWARFDie *)&TypeDie.Die);
      llvm::raw_ostream::operator<<(OS,"::");
    }
  }
  C = '*';
LAB_00d975e9:
  llvm::raw_ostream::operator<<(OS,C);
  return;
}

Assistant:

static void dumpTypeName(raw_ostream &OS, const DWARFDie &D) {
  if (!D.isValid())
    return;

  if (const char *Name = D.getName(DINameKind::LinkageName)) {
    OS << Name;
    return;
  }

  // FIXME: We should have pretty printers per language. Currently we print
  // everything as if it was C++ and fall back to the TAG type name.
  const dwarf::Tag T = D.getTag();
  switch (T) {
  case DW_TAG_array_type:
  case DW_TAG_pointer_type:
  case DW_TAG_ptr_to_member_type:
  case DW_TAG_reference_type:
  case DW_TAG_rvalue_reference_type:
  case DW_TAG_subroutine_type:
    break;
  default:
    dumpTypeTagName(OS, T);
  }

  // Follow the DW_AT_type if possible.
  DWARFDie TypeDie = D.getAttributeValueAsReferencedDie(DW_AT_type);
  dumpTypeName(OS, TypeDie);

  switch (T) {
  case DW_TAG_subroutine_type: {
    if (!TypeDie)
      OS << "void";
    OS << '(';
    bool First = true;
    for (const DWARFDie &C : D.children()) {
      if (C.getTag() == DW_TAG_formal_parameter) {
        if (!First)
          OS << ", ";
        First = false;
        dumpTypeName(OS, C.getAttributeValueAsReferencedDie(DW_AT_type));
      }
    }
    OS << ')';
    break;
  }
  case DW_TAG_array_type: {
    dumpArrayType(OS, D);
    break;
  }
  case DW_TAG_pointer_type:
    OS << '*';
    break;
  case DW_TAG_ptr_to_member_type:
    if (DWARFDie Cont =
            D.getAttributeValueAsReferencedDie(DW_AT_containing_type)) {
      dumpTypeName(OS << ' ', Cont);
      OS << "::";
    }
    OS << '*';
    break;
  case DW_TAG_reference_type:
    OS << '&';
    break;
  case DW_TAG_rvalue_reference_type:
    OS << "&&";
    break;
  default:
    break;
  }
}